

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraph.cpp
# Opt level: O2

bool __thiscall DynamicGraph::checkComponentNotBreak(DynamicGraph *this,Vertex v,Vertex u,Edge e)

{
  Edge e_00;
  Edge e_01;
  pointer puVar1;
  _List_node_base *p_Var2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  bool bVar5;
  Vertex VVar6;
  Vertex tmp;
  Vertex VVar7;
  bool bVar8;
  list<unsigned_long,_std::allocator<unsigned_long>_> queue;
  Vertex v_local;
  list<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
  actions;
  list<unsigned_long,_std::allocator<unsigned_long>_> incVertices;
  
  puVar1 = (this->level).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = puVar1[v];
  uVar4 = puVar1[u];
  v_local = v;
  if (uVar3 == uVar4) {
    this->halt = true;
    std::
    _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
    ::erase(&(this->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
             super__Vector_impl_data._M_start[v].b_sibl._M_t,&e);
    std::
    _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
    ::erase(&(this->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
             super__Vector_impl_data._M_start[u].b_sibl._M_t,&e);
    puVar1 = (this->level).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             .super__Vector_impl_data._M_start;
    uVar3 = puVar1[v];
    uVar4 = puVar1[u];
  }
  bVar5 = true;
  if (uVar3 != uVar4) {
    actions.
    super__List_base<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&actions;
    actions.
    super__List_base<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
    ._M_impl._M_node._M_size = 0;
    incVertices.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)&incVertices;
    incVertices.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
    _M_size = 0;
    VVar6 = v;
    VVar7 = u;
    if (puVar1[v] < puVar1[u]) {
      VVar6 = u;
      VVar7 = v;
      v_local = u;
    }
    actions.
    super__List_base<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         actions.
         super__List_base<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    incVertices.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
    super__List_node_base._M_prev =
         incVertices.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node
         .super__List_node_base._M_next;
    p_Var2 = (_List_node_base *)operator_new(0x28);
    e_00.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target =
         e.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target;
    e_00.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source =
         e.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source;
    e_00.m_eproperty = e.m_eproperty;
    Delete::Delete((Delete *)p_Var2,
                   &(this->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>.
                    _M_impl.super__Vector_impl_data._M_start[VVar7].c_succ,e_00);
    queue.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
    super__List_node_base._M_next = p_Var2;
    std::__cxx11::
    list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
    ::emplace_front<Delete*>
              ((list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
                *)&actions,(Delete **)&queue);
    std::
    _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
    ::erase(&(this->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
             super__Vector_impl_data._M_start[VVar7].c_succ._M_t,&e);
    p_Var2 = (_List_node_base *)operator_new(0x28);
    e_01.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target =
         e.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target;
    e_01.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source =
         e.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source;
    e_01.m_eproperty = e.m_eproperty;
    Delete::Delete((Delete *)p_Var2,
                   &(this->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>.
                    _M_impl.super__Vector_impl_data._M_start[VVar6].a_pred,e_01);
    queue.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
    super__List_node_base._M_next = p_Var2;
    std::__cxx11::
    list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
    ::emplace_front<Delete*>
              ((list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
                *)&actions,(Delete **)&queue);
    std::
    _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
    ::erase((_Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
             *)((this->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
                super__Vector_impl_data._M_start + VVar6),&e);
    bVar8 = *(size_t *)
             ((long)&(this->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>.
                     _M_impl.super__Vector_impl_data._M_start[VVar6].a_pred._M_t._M_impl + 0x28) ==
            0;
    bVar5 = !bVar8;
    if (bVar8) {
      queue.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node._M_size
           = 0;
      queue.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
      super__List_node_base._M_next = (_List_node_base *)&queue;
      queue.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
      super__List_node_base._M_prev = (_List_node_base *)&queue;
      std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&queue,&v_local);
      do {
        if (queue.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
            super__List_node_base._M_next == (_List_node_base *)&queue) {
          std::__cxx11::_List_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_clear
                    (&queue.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>);
          this->halt = true;
          std::__cxx11::_List_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_clear
                    (&incVertices.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>);
          std::__cxx11::
          _List_base<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
          ::_M_clear(&actions.
                      super__List_base<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
                    );
          return true;
        }
        p_Var2 = queue.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 _M_node.super__List_node_base._M_next[1]._M_next;
        std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::pop_front(&queue);
        dropLevel(this,(Vertex)p_Var2,&queue,&actions,&incVertices);
      } while (this->halt != true);
      rollBack(this,&actions,&incVertices);
      std::__cxx11::_List_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_clear
                (&queue.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>);
    }
    else {
      this->halt = true;
    }
    std::__cxx11::_List_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_clear
              (&incVertices.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::__cxx11::
    _List_base<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
    ::_M_clear(&actions.
                super__List_base<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
              );
  }
  return bVar5;
}

Assistant:

bool DynamicGraph::checkComponentNotBreak(Vertex v, Vertex u, Edge e)
{
    // Case 1: v and u are on the same level
    if (this->level[v]==this->level[u]) {
        this->halt = true;
        this->relatives[v].b_sibl.erase(e);
        this->relatives[u].b_sibl.erase(e);
    }

    // Case 2: v and u are on different levels
    if (this->level[v]!=this->level[u]) {
        std::list<std::unique_ptr<Action>> actions; // changes stack
        std::list<Vertex> incVertices; // vertices dropped stack (each vertex multible times)
        // For Generality u in Li-1 and v Li
        if (this->level[v] < this->level[u]) {
            Vertex tmp = v;
            v = u;
            u = tmp;
        }

        actions.emplace_front(new Delete(this->relatives[u].c_succ, e));
        this->relatives[u].c_succ.erase(e);
        actions.emplace_front(new Delete(this->relatives[v].a_pred, e));
        this->relatives[v].a_pred.erase(e);

        // Case 2.1: a_pred(v) is not empty
        if(!this->relatives[v].a_pred.empty()) {
            this->halt = true;
            return true;
        }
        // Case 2.2 a_pred(v) is empty
        else {
            std::list<Vertex> queue;
            queue.push_back(v);

            // If Q is empty, the procedure and both processes halt
            while(!queue.empty()) {
                // Let w be the first element of Q. Remove w from Q
                Vertex w = queue.front();
                queue.pop_front();
                dropLevel(w, queue, actions, incVertices);

                // Repeat
                if(this->halt) {
                    this->rollBack(actions, incVertices);
                    return false;
                }
            }
        }
        this->halt = true;
    }
    return true;
}